

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldDescriptorProto::Clear(FieldDescriptorProto *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_1ea;
  byte local_1e9;
  LogMessage local_1e8;
  LogFinisher local_1aa;
  byte local_1a9;
  LogMessage local_1a8;
  LogFinisher local_16a;
  byte local_169;
  LogMessage local_168;
  LogFinisher local_12a;
  byte local_129;
  LogMessage local_128;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogFinisher local_ad [20];
  byte local_99;
  LogMessage local_98;
  FieldDescriptorProto *local_60;
  FieldDescriptorProto *this_local;
  InternalMetadataWithArena *local_50;
  InternalMetadataWithArena *local_48;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_18 = &this->_has_bits_;
  local_1c = 0;
  local_60 = this;
  if ((local_18->has_bits_[0] & 0x3f) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->name_,psVar2);
      local_99 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x114e);
        local_99 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_98,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_ad,pLVar3);
      }
      if ((local_99 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_98);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_extendee(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->extendee_,psVar2);
      local_e9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1152);
        local_e9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_e8,
                            "CHECK failed: !extendee_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_ea,pLVar3);
      }
      if ((local_e9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_e8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->extendee_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_type_name(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->type_name_,psVar2);
      local_129 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_128,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1156);
        local_129 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_128,
                            "CHECK failed: !type_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_12a,pLVar3);
      }
      if ((local_129 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_128);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->type_name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_default_value(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->default_value_,psVar2);
      local_169 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_168,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x115a);
        local_169 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_168,
                            "CHECK failed: !default_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_16a,pLVar3);
      }
      if ((local_169 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_168);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->default_value_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_json_name(this);
    if (bVar1) {
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->json_name_,psVar2);
      local_1a9 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_1a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x115e);
        local_1a9 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_1a8,
                            "CHECK failed: !json_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_1aa,pLVar3);
      }
      if ((local_1a9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_1a8);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->json_name_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_options(this);
    if (bVar1) {
      local_1e9 = 0;
      if (this->options_ == (FieldOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_1e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1162);
        local_1e9 = 1;
        pLVar3 = internal::LogMessage::operator<<(&local_1e8,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_1ea,pLVar3);
      }
      if ((local_1e9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_1e8);
      }
      FieldOptions::Clear(this->options_);
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0xc0) != 0) {
    memset(&this->number_,0,8);
  }
  local_38 = &this->_has_bits_;
  local_3c = 0;
  if ((local_38->has_bits_[0] & 0x300) != 0) {
    this->label_ = 1;
    this->type_ = 1;
  }
  this_local = (FieldDescriptorProto *)&this->_has_bits_;
  memset(this_local,0,4);
  local_50 = &this->_internal_metadata_;
  if (((uint)(local_50->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_48 = local_50;
    local_10 = local_50;
    internal::InternalMetadataWithArena::DoClear(local_50);
  }
  return;
}

Assistant:

void FieldDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldDescriptorProto)
  if (_has_bits_[0 / 32] & 63u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_extendee()) {
      GOOGLE_DCHECK(!extendee_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*extendee_.UnsafeRawStringPointer())->clear();
    }
    if (has_type_name()) {
      GOOGLE_DCHECK(!type_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*type_name_.UnsafeRawStringPointer())->clear();
    }
    if (has_default_value()) {
      GOOGLE_DCHECK(!default_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*default_value_.UnsafeRawStringPointer())->clear();
    }
    if (has_json_name()) {
      GOOGLE_DCHECK(!json_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*json_name_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::FieldOptions::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 192u) {
    ::memset(&number_, 0, reinterpret_cast<char*>(&oneof_index_) -
      reinterpret_cast<char*>(&number_) + sizeof(oneof_index_));
  }
  if (_has_bits_[8 / 32] & 768u) {
    label_ = 1;
    type_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}